

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quaternion.cpp
# Opt level: O0

quaternion_t * opengv::math::rot2quaternion(rotation_t *R)

{
  double dVar1;
  double dVar2;
  Scalar SVar3;
  Scalar SVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  quaternion_t *in_RDI;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  double scale;
  quaternion_t *q;
  Index in_stack_fffffffffffffd18;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *in_stack_fffffffffffffd20;
  DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *this;
  
  Eigen::Matrix<double,_4,_1,_0,_4,_1>::Matrix((Matrix<double,_4,_1,_0,_4,_1> *)0xacaa6f);
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacaa83);
  dVar7 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacaaa5);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacaad0);
  dVar2 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pSVar6 = (dVar7 + dVar1 + dVar2 + 1.0) / 4.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacab30);
  dVar7 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacab52);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacab7d);
  dVar2 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pSVar6 = (((dVar7 - dVar1) - dVar2) + 1.0) / 4.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacabde);
  dVar7 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacac17);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacac42);
  dVar2 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pSVar6 = (((-dVar7 + dVar1) - dVar2) + 1.0) / 4.0;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacaca3);
  dVar7 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacacdc);
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                      in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacad07);
  dVar2 = *pdVar5;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pSVar6 = ((-dVar7 - dVar1) + dVar2 + 1.0) / 4.0;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (*pSVar6 < 0.0) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    *pSVar6 = 0.0;
  }
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (*pSVar6 < 0.0) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    *pSVar6 = 0.0;
  }
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (*pSVar6 < 0.0) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    *pSVar6 = 0.0;
  }
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (*pSVar6 < 0.0) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    *pSVar6 = 0.0;
  }
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  dVar7 = sqrt(*pSVar6);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pSVar6 = dVar7;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  dVar7 = sqrt(*pSVar6);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pSVar6 = dVar7;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  dVar7 = sqrt(*pSVar6);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pSVar6 = dVar7;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  dVar7 = sqrt(*pSVar6);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  *pSVar6 = dVar7;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  dVar7 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (*pSVar6 <= dVar7) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    dVar7 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    if (*pSVar6 <= dVar7) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      dVar7 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      if (*pSVar6 <= dVar7) {
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = *pSVar6 * 1.0;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb035);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb059);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb086);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb0aa);
        auVar26._8_8_ = 0x7fffffffffffffff;
        auVar26._0_8_ = 0x7fffffffffffffff;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar2 - *pdVar5;
        auVar11 = vpand_avx(auVar11,auVar26);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 - dVar1) / auVar11._0_8_) * *pSVar6;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb113);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb136);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb162);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb185);
        auVar27._8_8_ = 0x7fffffffffffffff;
        auVar27._0_8_ = 0x7fffffffffffffff;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = dVar2 - *pdVar5;
        auVar11 = vpand_avx(auVar12,auVar27);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 - dVar1) / auVar11._0_8_) * *pSVar6;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb1ee);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb211);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb23d);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb260);
        auVar28._8_8_ = 0x7fffffffffffffff;
        auVar28._0_8_ = 0x7fffffffffffffff;
        auVar13._8_8_ = 0;
        auVar13._0_8_ = dVar2 - *pdVar5;
        auVar11 = vpand_avx(auVar13,auVar28);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 - dVar1) / auVar11._0_8_) * *pSVar6;
        goto LAB_00acbd37;
      }
    }
  }
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  dVar7 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (*pSVar6 <= dVar7) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    dVar7 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    if (*pSVar6 <= dVar7) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      dVar7 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      if (*pSVar6 <= dVar7) {
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb39a);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb3be);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb3eb);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb40f);
        auVar29._8_8_ = 0x7fffffffffffffff;
        auVar29._0_8_ = 0x7fffffffffffffff;
        auVar14._8_8_ = 0;
        auVar14._0_8_ = dVar2 - *pdVar5;
        auVar11 = vpand_avx(auVar14,auVar29);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 - dVar1) / auVar11._0_8_) * *pSVar6;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = *pSVar6 * 1.0;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb499);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb4bc);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb4e8);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb50b);
        auVar30._8_8_ = 0x7fffffffffffffff;
        auVar30._0_8_ = 0x7fffffffffffffff;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = dVar2 + *pdVar5;
        auVar11 = vpand_avx(auVar15,auVar30);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 + dVar1) / auVar11._0_8_) * *pSVar6;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb574);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb597);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb5c3);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb5e6);
        auVar31._8_8_ = 0x7fffffffffffffff;
        auVar31._0_8_ = 0x7fffffffffffffff;
        auVar16._8_8_ = 0;
        auVar16._0_8_ = dVar2 + *pdVar5;
        auVar11 = vpand_avx(auVar16,auVar31);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 + dVar1) / auVar11._0_8_) * *pSVar6;
        goto LAB_00acbd37;
      }
    }
  }
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  dVar7 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (*pSVar6 <= dVar7) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    dVar7 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    if (*pSVar6 <= dVar7) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      dVar7 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      if (*pSVar6 <= dVar7) {
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb71f);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb742);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb76e);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb791);
        auVar32._8_8_ = 0x7fffffffffffffff;
        auVar32._0_8_ = 0x7fffffffffffffff;
        auVar17._8_8_ = 0;
        auVar17._0_8_ = dVar2 - *pdVar5;
        auVar11 = vpand_avx(auVar17,auVar32);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 - dVar1) / auVar11._0_8_) * *pSVar6;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb7f9);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb81c);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb848);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb86b);
        auVar33._8_8_ = 0x7fffffffffffffff;
        auVar33._0_8_ = 0x7fffffffffffffff;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar2 + *pdVar5;
        auVar11 = vpand_avx(auVar18,auVar33);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 + dVar1) / auVar11._0_8_) * *pSVar6;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = *pSVar6 * 1.0;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb8f7);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb91b);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb948);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacb96c);
        auVar34._8_8_ = 0x7fffffffffffffff;
        auVar34._0_8_ = 0x7fffffffffffffff;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar2 + *pdVar5;
        auVar11 = vpand_avx(auVar19,auVar34);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 + dVar1) / auVar11._0_8_) * *pSVar6;
        goto LAB_00acbd37;
      }
    }
  }
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  dVar7 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  if (*pSVar6 <= dVar7) {
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    dVar7 = *pSVar6;
    pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                       (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
    if (*pSVar6 <= dVar7) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      dVar7 = *pSVar6;
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                         (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
      if (*pSVar6 <= dVar7) {
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbaa5);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbac5);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbaeb);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbb0b);
        auVar35._8_8_ = 0x7fffffffffffffff;
        auVar35._0_8_ = 0x7fffffffffffffff;
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar2 - *pdVar5;
        auVar11 = vpand_avx(auVar20,auVar35);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 - dVar1) / auVar11._0_8_) * *pSVar6;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbb67);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbb8a);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbbb6);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbbd9);
        auVar36._8_8_ = 0x7fffffffffffffff;
        auVar36._0_8_ = 0x7fffffffffffffff;
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar2 + *pdVar5;
        auVar11 = vpand_avx(auVar21,auVar36);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 + dVar1) / auVar11._0_8_) * *pSVar6;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbc43);
        dVar7 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbc67);
        dVar1 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbc94);
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>::operator()
                           ((DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0> *)
                            in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,0xacbcb8);
        auVar37._8_8_ = 0x7fffffffffffffff;
        auVar37._0_8_ = 0x7fffffffffffffff;
        auVar22._8_8_ = 0;
        auVar22._0_8_ = dVar2 + *pdVar5;
        auVar11 = vpand_avx(auVar22,auVar37);
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = ((dVar7 + dVar1) / auVar11._0_8_) * *pSVar6;
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                           (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
        *pSVar6 = *pSVar6 * 1.0;
      }
    }
  }
LAB_00acbd37:
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  SVar3 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  SVar4 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (in_stack_fffffffffffffd20,in_stack_fffffffffffffd18);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1> *)*pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (this,in_stack_fffffffffffffd18);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = SVar4;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = SVar3;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = (double)this * *pSVar6;
  auVar11 = vfmadd213sd_fma(auVar8,auVar23,auVar38);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (this,in_stack_fffffffffffffd18);
  SVar3 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (this,in_stack_fffffffffffffd18);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = auVar11._0_8_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = SVar3;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *pSVar6;
  auVar11 = vfmadd213sd_fma(auVar9,auVar24,auVar39);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (this,in_stack_fffffffffffffd18);
  SVar3 = *pSVar6;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (this,in_stack_fffffffffffffd18);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = auVar11._0_8_;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = SVar3;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *pSVar6;
  auVar11 = vfmadd213sd_fma(auVar10,auVar25,auVar40);
  dVar7 = sqrt(auVar11._0_8_);
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (this,in_stack_fffffffffffffd18);
  *pSVar6 = *pSVar6 / dVar7;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (this,in_stack_fffffffffffffd18);
  *pSVar6 = *pSVar6 / dVar7;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (this,in_stack_fffffffffffffd18);
  *pSVar6 = *pSVar6 / dVar7;
  pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>,_1>::operator[]
                     (this,in_stack_fffffffffffffd18);
  *pSVar6 = *pSVar6 / dVar7;
  return in_RDI;
}

Assistant:

opengv::quaternion_t
opengv::math::rot2quaternion( const rotation_t & R )
{
  quaternion_t q;
    
  q[0] = ( R(0,0) + R(1,1) + R(2,2) + 1.0) / 4.0;
  q[1] = ( R(0,0) - R(1,1) - R(2,2) + 1.0) / 4.0;
  q[2] = (-R(0,0) + R(1,1) - R(2,2) + 1.0) / 4.0;
  q[3] = (-R(0,0) - R(1,1) + R(2,2) + 1.0) / 4.0;
  if(q[0] < 0.0) q[0] = 0.0;
  if(q[1] < 0.0) q[1] = 0.0;
  if(q[2] < 0.0) q[2] = 0.0;
  if(q[3] < 0.0) q[3] = 0.0;
  q[0] = sqrt(q[0]);
  q[1] = sqrt(q[1]);
  q[2] = sqrt(q[2]);
  q[3] = sqrt(q[3]);
  if(q[0] >= q[1] && q[0] >= q[2] && q[0] >= q[3])
  {
    q[0] *= +1.0;
    q[1] *= ((R(2,1)-R(1,2))/fabs(R(2,1)-R(1,2)));
    q[2] *= ((R(0,2)-R(2,0))/fabs(R(0,2)-R(2,0)));
    q[3] *= ((R(1,0)-R(0,1))/fabs(R(1,0)-R(0,1)));
  }
  else if(q[1] >= q[0] && q[1] >= q[2] && q[1] >= q[3])
  {
    q[0] *= ((R(2,1)-R(1,2))/fabs(R(2,1)-R(1,2)));
    q[1] *= +1.0;
    q[2] *= ((R(1,0)+R(0,1))/fabs(R(1,0)+R(0,1)));
    q[3] *= ((R(0,2)+R(2,0))/fabs(R(0,2)+R(2,0)));
  }
  else if(q[2] >= q[0] && q[2] >= q[1] && q[2] >= q[3])
  {
    q[0] *= ((R(0,2)-R(2,0))/fabs(R(0,2)-R(2,0)));
    q[1] *= ((R(1,0)+R(0,1))/fabs(R(1,0)+R(0,1)));
    q[2] *= +1.0;
    q[3] *= ((R(2,1)+R(1,2))/fabs(R(2,1)+R(1,2)));
  }
  else if(q[3] >= q[0] && q[3] >= q[1] && q[3] >= q[2])
  {
    q[0] *= ((R(1,0)-R(0,1))/fabs(R(1,0)-R(0,1)));
    q[1] *= ((R(2,0)+R(0,2))/fabs(R(2,0)+R(0,2)));
    q[2] *= ((R(2,1)+R(1,2))/fabs(R(2,1)+R(1,2)));  
    q[3] *= +1.0;
  }
  else
    {};/*std::cout << "quaternion error" << std::endl;*/
  
  double scale = sqrt(q[0]*q[0]+q[1]*q[1]+q[2]*q[2]+q[3]*q[3]);
  q[0] /= scale;
  q[1] /= scale;
  q[2] /= scale;
  q[3] /= scale;
  
  return q;
}